

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicg.h
# Opt level: O1

int BiCG<TPZMatrix<float>,TPZFMatrix<float>,TPZMatrixSolver<float>,double>
              (TPZMatrix<float> *A,TPZFMatrix<float> *x,TPZFMatrix<float> *b,
              TPZMatrixSolver<float> *M,int64_t *max_iter,double *tol)

{
  bool bVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  TPZFMatrix<float> alpha;
  TPZFMatrix<float> rho_1;
  TPZFMatrix<float> beta;
  TPZFMatrix<float> rho_2;
  TPZFMatrix<float> rtilde;
  TPZFMatrix<float> r;
  double local_7b8;
  TPZFMatrix<float> local_780;
  TPZFMatrix<float> local_6f0;
  TPZFMatrix<float> local_660;
  TPZFMatrix<float> local_5d0;
  TPZFMatrix<float> local_540;
  TPZFMatrix<float> local_4b0;
  TPZFMatrix<float> local_420;
  TPZFMatrix<float> local_390;
  TPZFMatrix<float> local_300;
  TPZFMatrix<float> local_270;
  TPZFMatrix<float> local_1e0;
  TPZFMatrix<float> local_150;
  TPZFMatrix<float> local_c0;
  
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 1;
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_6f0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_6f0.fElem = (float *)0x0;
  local_6f0.fGiven = (float *)0x0;
  local_6f0.fSize = 0;
  TPZVec<int>::TPZVec(&local_6f0.fPivot.super_TPZVec<int>,0);
  local_6f0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_6f0.fPivot.super_TPZVec<int>.fStore = local_6f0.fPivot.fExtAlloc;
  local_6f0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_6f0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_6f0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_6f0.fWork.fStore = (float *)0x0;
  local_6f0.fWork.fNElements = 0;
  local_6f0.fWork.fNAlloc = 0;
  local_6f0.fElem = (float *)operator_new__(4);
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 1;
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_5d0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_5d0.fElem = (float *)0x0;
  local_5d0.fGiven = (float *)0x0;
  local_5d0.fSize = 0;
  TPZVec<int>::TPZVec(&local_5d0.fPivot.super_TPZVec<int>,0);
  local_5d0.fPivot.super_TPZVec<int>.fStore = local_5d0.fPivot.fExtAlloc;
  local_5d0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_5d0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_5d0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_5d0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_5d0.fWork.fStore = (float *)0x0;
  local_5d0.fWork.fNElements = 0;
  local_5d0.fWork.fNAlloc = 0;
  local_5d0.fElem = (float *)operator_new__(4);
  local_780.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 1;
  local_780.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_780.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_780.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_780.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_780.fElem = (float *)0x0;
  local_780.fGiven = (float *)0x0;
  local_780.fSize = 0;
  TPZVec<int>::TPZVec(&local_780.fPivot.super_TPZVec<int>,0);
  local_780.fPivot.super_TPZVec<int>.fStore = local_780.fPivot.fExtAlloc;
  local_780.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_780.fPivot.super_TPZVec<int>.fNElements = 0;
  local_780.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_780.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_780.fWork.fStore = (float *)0x0;
  local_780.fWork.fNElements = 0;
  local_780.fWork.fNAlloc = 0;
  local_780.fElem = (float *)operator_new__(4);
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 1;
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_660.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_660.fElem = (float *)0x0;
  local_660.fGiven = (float *)0x0;
  local_660.fSize = 0;
  TPZVec<int>::TPZVec(&local_660.fPivot.super_TPZVec<int>,0);
  local_660.fPivot.super_TPZVec<int>.fStore = local_660.fPivot.fExtAlloc;
  local_660.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_660.fPivot.super_TPZVec<int>.fNElements = 0;
  local_660.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_660.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_660.fWork.fStore = (float *)0x0;
  local_660.fWork.fNElements = 0;
  local_660.fWork.fNAlloc = 0;
  local_660.fElem = (float *)operator_new__(4);
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_390.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_390.fElem = (float *)0x0;
  local_390.fGiven = (float *)0x0;
  local_390.fSize = 0;
  TPZVec<int>::TPZVec(&local_390.fPivot.super_TPZVec<int>,0);
  local_390.fPivot.super_TPZVec<int>.fStore = local_390.fPivot.fExtAlloc;
  local_390.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_390.fPivot.super_TPZVec<int>.fNElements = 0;
  local_390.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_390.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_390.fWork.fStore = (float *)0x0;
  local_390.fWork.fNElements = 0;
  local_390.fWork.fNAlloc = 0;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_1e0.fElem = (float *)0x0;
  local_1e0.fGiven = (float *)0x0;
  local_1e0.fSize = 0;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_1e0.fWork.fStore = (float *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_420.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_420.fElem = (float *)0x0;
  local_420.fGiven = (float *)0x0;
  local_420.fSize = 0;
  TPZVec<int>::TPZVec(&local_420.fPivot.super_TPZVec<int>,0);
  local_420.fPivot.super_TPZVec<int>.fStore = local_420.fPivot.fExtAlloc;
  local_420.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_420.fPivot.super_TPZVec<int>.fNElements = 0;
  local_420.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_420.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_420.fWork.fStore = (float *)0x0;
  local_420.fWork.fNElements = 0;
  local_420.fWork.fNAlloc = 0;
  local_4b0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_4b0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_4b0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_4b0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_4b0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_4b0.fElem = (float *)0x0;
  local_4b0.fGiven = (float *)0x0;
  local_4b0.fSize = 0;
  TPZVec<int>::TPZVec(&local_4b0.fPivot.super_TPZVec<int>,0);
  local_4b0.fPivot.super_TPZVec<int>.fStore = local_4b0.fPivot.fExtAlloc;
  local_4b0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_4b0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_4b0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_4b0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_4b0.fWork.fStore = (float *)0x0;
  local_4b0.fWork.fNElements = 0;
  local_4b0.fWork.fNAlloc = 0;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_270.fElem = (float *)0x0;
  local_270.fGiven = (float *)0x0;
  local_270.fSize = 0;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_270.fWork.fStore = (float *)0x0;
  local_270.fWork.fNElements = 0;
  iVar3 = 0;
  local_270.fWork.fNAlloc = 0;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_150.fElem = (float *)0x0;
  local_150.fGiven = (float *)0x0;
  local_150.fSize = 0;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_150.fWork.fStore = (float *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  fVar5 = Dot<float>(b,b);
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  TPZMatrix<float>::operator*(&local_540,A,x);
  TPZFMatrix<float>::operator-(&local_300,b,&local_540);
  TPZFMatrix<float>::~TPZFMatrix(&local_540);
  TPZFMatrix<float>::TPZFMatrix(&local_540,&local_300);
  local_7b8 = (double)fVar5;
  if ((fVar5 == 0.0) && (!NAN(fVar5))) {
    local_7b8 = 1.0;
  }
  fVar5 = Dot<float>(&local_300,&local_300);
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  uVar7 = (uint)(-(ulong)((double)fVar5 / local_7b8 <= *tol) >> 0x20) & 0x3ff00000;
  dVar2 = (double)((ulong)uVar7 << 0x20);
  if (*tol < (double)fVar5 / local_7b8) {
    bVar1 = *max_iter < 1;
    if (0 < *max_iter) {
      lVar4 = 0;
      dVar2 = (double)((ulong)uVar7 << 0x20);
      do {
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_300,&local_390,0);
        (*(M->super_TPZSolver).super_TPZSavable._vptr_TPZSavable[0xb])(M,&local_540,&local_1e0,0);
        fVar5 = Dot<float>(&local_390,&local_540);
        *local_6f0.fElem = fVar5;
        if ((fVar5 == 0.0) && (!NAN(fVar5))) {
          fVar5 = Dot<float>(&local_300,&local_300);
          if (fVar5 < 0.0) {
            fVar5 = sqrtf(fVar5);
          }
          else {
            fVar5 = SQRT(fVar5);
          }
          local_7b8 = (double)fVar5 / local_7b8;
          iVar3 = 2;
LAB_00c73c94:
          *tol = local_7b8;
          *max_iter = lVar4 + 1;
          break;
        }
        if (lVar4 == 0) {
          TPZFMatrix<float>::operator=(&local_420,&local_390);
          TPZFMatrix<float>::operator=(&local_4b0,&local_1e0);
        }
        else {
          fVar6 = *local_5d0.fElem;
          *local_660.fElem = fVar5 / fVar6;
          TPZFMatrix<float>::TimesBetaPlusZ(&local_420,fVar5 / fVar6,&local_390);
          TPZFMatrix<float>::TimesBetaPlusZ(&local_4b0,*local_660.fElem,&local_1e0);
        }
        TPZMatrix<float>::operator*(&local_c0,A,&local_420);
        TPZFMatrix<float>::operator=(&local_270,&local_c0);
        TPZFMatrix<float>::~TPZFMatrix(&local_c0);
        iVar3 = 1;
        (*(A->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(A,&local_4b0,&local_150)
        ;
        fVar5 = *local_6f0.fElem;
        fVar6 = Dot<float>(&local_4b0,&local_270);
        *local_780.fElem = fVar5 / fVar6;
        TPZFMatrix<float>::operator*(&local_c0,&local_420,*local_780.fElem);
        TPZFMatrix<float>::operator+=(x,&local_c0.super_TPZMatrix<float>);
        TPZFMatrix<float>::~TPZFMatrix(&local_c0);
        TPZFMatrix<float>::operator*(&local_c0,&local_270,*local_780.fElem);
        TPZFMatrix<float>::operator-=(&local_300,&local_c0.super_TPZMatrix<float>);
        TPZFMatrix<float>::~TPZFMatrix(&local_c0);
        TPZFMatrix<float>::operator*(&local_c0,&local_150,*local_780.fElem);
        TPZFMatrix<float>::operator-=(&local_540,&local_c0.super_TPZMatrix<float>);
        TPZFMatrix<float>::~TPZFMatrix(&local_c0);
        *local_5d0.fElem = *local_6f0.fElem;
        fVar5 = Dot<float>(&local_300,&local_300);
        if (fVar5 < 0.0) {
          fVar5 = sqrtf(fVar5);
        }
        else {
          fVar5 = SQRT(fVar5);
        }
        dVar2 = (double)fVar5 / local_7b8;
        if (dVar2 < *tol) {
          iVar3 = 0;
          local_7b8 = dVar2;
          goto LAB_00c73c94;
        }
        lVar4 = lVar4 + 1;
        bVar1 = *max_iter <= lVar4;
      } while (lVar4 < *max_iter);
    }
    if (bVar1) {
      *tol = dVar2;
      iVar3 = 1;
    }
  }
  else {
    *tol = (double)((ulong)uVar7 << 0x20);
    *max_iter = 0;
    iVar3 = 0;
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_540);
  TPZFMatrix<float>::~TPZFMatrix(&local_300);
  TPZFMatrix<float>::~TPZFMatrix(&local_150);
  TPZFMatrix<float>::~TPZFMatrix(&local_270);
  TPZFMatrix<float>::~TPZFMatrix(&local_4b0);
  TPZFMatrix<float>::~TPZFMatrix(&local_420);
  TPZFMatrix<float>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<float>::~TPZFMatrix(&local_390);
  TPZFMatrix<float>::~TPZFMatrix(&local_660);
  TPZFMatrix<float>::~TPZFMatrix(&local_780);
  TPZFMatrix<float>::~TPZFMatrix(&local_5d0);
  TPZFMatrix<float>::~TPZFMatrix(&local_6f0);
  return iVar3;
}

Assistant:

int 
BiCG( Matrix &A, Vector &x, const Vector &b,
     Preconditioner &M, int64_t &max_iter, Real &tol)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1);
	Vector z, ztilde, p, ptilde, q, qtilde;
	
	Real normb = TPZExtractVal::val(Norm(b));
	Vector r = b - A * x;
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = (TPZExtractVal::val(Norm(r)) / normb) <= tol)) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		M.Solve(r,z);
		M.Solve(rtilde,ztilde);
		rho_1(0) = Dot(z, rtilde);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = (TPZExtractVal::val(Norm(r))) / normb;
			max_iter = i;
			return 2;
		}
		if (i == 1) {
			p = z;
			ptilde = ztilde;
		} else {
			beta(0) = rho_1(0) / rho_2(0);
			p.TimesBetaPlusZ(beta(0),z);
			ptilde.TimesBetaPlusZ(beta(0),ztilde);
		}
		q = A * p;
		A.Multiply(ptilde,qtilde,1);
		alpha(0) = rho_1(0) / Dot(ptilde, q);
		x += alpha(0) * p;
		r -= alpha(0) * q;
		rtilde -= alpha(0) * qtilde;
		
		rho_2(0) = rho_1(0);
		if ((resid = (TPZExtractVal::val(Norm(r))) / normb) < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
	}
	
	tol = resid;
	return 1;
}